

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

float Scl_LibertyReadDefaultMaxTrans(Scl_Tree_t *p)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *__nptr;
  double dVar3;
  Scl_Item_t *local_20;
  Scl_Item_t *pItem;
  Scl_Tree_t *p_local;
  
  pSVar2 = Scl_LibertyRoot(p);
  local_20 = Scl_LibertyItem(p,pSVar2->Child);
  while( true ) {
    if (local_20 == (Scl_Item_t *)0x0) {
      return 0.0;
    }
    iVar1 = Scl_LibertyCompare(p,local_20->Key,"default_max_transition");
    if (iVar1 == 0) break;
    local_20 = Scl_LibertyItem(p,local_20->Next);
  }
  __nptr = Scl_LibertyReadString(p,local_20->Head);
  dVar3 = atof(__nptr);
  return (float)dVar3;
}

Assistant:

float Scl_LibertyReadDefaultMaxTrans( Scl_Tree_t * p )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "default_max_transition" )
        return atof(Scl_LibertyReadString(p, pItem->Head));
    return 0;
}